

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

void aom_highbd_quantize_b_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int local_4068 [6];
  int16_t *local_4050;
  int16_t *local_4048;
  int16_t *local_4040;
  int aiStack_4038 [4098];
  
  bVar5 = (byte)log_scale;
  iVar11 = (1 << (bVar5 & 0x1f)) >> 1;
  local_4068[2] = *zbin_ptr + iVar11 >> (bVar5 & 0x1f);
  local_4068[3] = zbin_ptr[1] + iVar11 >> (bVar5 & 0x1f);
  local_4068[0] = -local_4068[2];
  local_4068[1] = -local_4068[3];
  uVar13 = 0;
  local_4050 = round_ptr;
  local_4048 = quant_ptr;
  local_4040 = quant_shift_ptr;
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  if (0 < n_coeffs) {
    lVar4 = 0;
    do {
      sVar1 = scan[lVar4];
      if (qm_ptr == (qm_val_t *)0x0) {
        uVar6 = 0x20;
      }
      else {
        uVar6 = (uint)qm_ptr[sVar1];
      }
      if ((local_4068[(ulong)(sVar1 != 0) + 2] * 0x20 <= (int)(uVar6 * coeff_ptr[sVar1])) ||
         ((int)(uVar6 * coeff_ptr[sVar1]) <= local_4068[sVar1 != 0] * 0x20)) {
        lVar7 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        aiStack_4038[lVar7] = (int)lVar4;
      }
      lVar4 = lVar4 + 1;
    } while (n_coeffs != lVar4);
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    else {
      iVar14 = -1;
      uVar12 = 0;
      do {
        iVar2 = aiStack_4038[uVar12];
        sVar1 = scan[iVar2];
        if (qm_ptr == (qm_val_t *)0x0) {
          uVar9 = 0x20;
        }
        else {
          uVar9 = (ulong)qm_ptr[sVar1];
        }
        if (iqm_ptr == (qm_val_t *)0x0) {
          uVar6 = 0x20;
        }
        else {
          uVar6 = (uint)iqm_ptr[sVar1];
        }
        uVar3 = coeff_ptr[sVar1] >> 0x1f;
        uVar10 = (ulong)((uint)(sVar1 != 0) * 2);
        lVar4 = uVar9 * (long)(int)((*(short *)((long)local_4050 + uVar10) + iVar11 >>
                                    (bVar5 & 0x1f)) + ((coeff_ptr[sVar1] ^ uVar3) - uVar3));
        uVar8 = (uint)((long)*(short *)((long)local_4040 + uVar10) *
                       ((*(short *)((long)local_4048 + uVar10) * lVar4 >> 0x10) + lVar4) >>
                      (0x15 - bVar5 & 0x3f));
        qcoeff_ptr[sVar1] = (uVar3 ^ uVar8) - uVar3;
        dqcoeff_ptr[sVar1] =
             ((int)(((int)((int)*(short *)((long)dequant_ptr + uVar10) * uVar6 + 0x10) >> 5) * uVar8
                   ) >> (bVar5 & 0x1f) ^ uVar3) - uVar3;
        if (uVar8 != 0) {
          iVar14 = iVar2;
        }
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
      uVar13 = iVar14 + 1;
    }
  }
  *eob_ptr = (uint16_t)uVar13;
  return;
}

Assistant:

void aom_highbd_quantize_b_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, const int log_scale) {
  int i, eob = -1;
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int dequant;
  int idx_arr[4096];
  (void)iscan;
  int idx = 0;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = 0; i < n_coeffs; i++) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;

    // If the coefficient is out of the base ZBIN range, keep it for
    // quantization.
    if (coeff >= (zbins[rc != 0] * (1 << AOM_QM_BITS)) ||
        coeff <= (nzbins[rc != 0] * (1 << AOM_QM_BITS)))
      idx_arr[idx++] = i;
  }

  // Quantization pass: only process the coefficients selected in
  // pre-scan pass. Note: idx can be zero.
  for (i = 0; i < idx; i++) {
    const int rc = scan[idx_arr[i]];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const qm_val_t iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    const int64_t tmp1 =
        abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale);
    const int64_t tmpw = tmp1 * wt;
    const int64_t tmp2 = ((tmpw * quant_ptr[rc != 0]) >> 16) + tmpw;
    const int abs_qcoeff = (int)((tmp2 * quant_shift_ptr[rc != 0]) >>
                                 (16 - log_scale + AOM_QM_BITS));
    qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
    dequant =
        (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >> AOM_QM_BITS;
    const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
    dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
    if (abs_qcoeff) eob = idx_arr[i];
  }
  *eob_ptr = eob + 1;
}